

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

JavascriptString * GetPropertyDisplayNameForError(Var prop,ScriptContext *scriptContext)

{
  bool bVar1;
  JavascriptSymbol *pJVar2;
  JavascriptString *pJVar3;
  
  bVar1 = Js::VarIs<Js::JavascriptSymbol>(prop);
  if (bVar1) {
    pJVar2 = Js::UnsafeVarTo<Js::JavascriptSymbol>(prop);
  }
  else {
    pJVar2 = (JavascriptSymbol *)0x0;
  }
  if (pJVar2 != (JavascriptSymbol *)0x0) {
    pJVar3 = Js::JavascriptSymbol::ToString
                       ((pJVar2->propertyRecordUsageCache).propertyRecord.ptr,scriptContext);
    return pJVar3;
  }
  pJVar3 = Js::JavascriptConversion::ToString(prop,scriptContext);
  return pJVar3;
}

Assistant:

Js::JavascriptString* GetPropertyDisplayNameForError(Var prop, ScriptContext* scriptContext)
    {
        JavascriptString* str;
        JavascriptSymbol *symbol = JavascriptOperators::TryFromVar<JavascriptSymbol>(prop);
        if (symbol)
        {
            str = JavascriptSymbol::ToString(symbol->GetValue(), scriptContext);
        }
        else
        {
            str = JavascriptConversion::ToString(prop, scriptContext);
        }

        return str;
    }